

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_optimizePureApplication
          (sysbvm_context_t *context,sysbvm_astFunctionApplicationNode_t **applicationNode)

{
  _Bool _Var1;
  size_t argumentCount;
  sysbvm_bitflags_t applicationFlags;
  sysbvm_tuple_t sVar2;
  _Bool local_15a;
  size_t local_158;
  size_t i_1;
  sysbvm_stackFrameGCRootsRecord_t callFrameStackRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  size_t i;
  size_t applicationArgumentCount;
  undefined1 local_68 [7];
  _Bool canOptimizeCall;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_99cd4f77 gcFrame;
  sysbvm_astFunctionApplicationNode_t **applicationNode_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x28);
  memset(local_68,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_68);
  applicationArgumentCount._7_1_ = false;
  _Var1 = sysbvm_astNode_isLiteralNode(context,(*applicationNode)->functionExpression);
  if (_Var1) {
    gcFrame.argumentNode = sysbvm_astLiteralNode_getValue((*applicationNode)->functionExpression);
    applicationArgumentCount._7_1_ = sysbvm_function_isPure(context,gcFrame.argumentNode);
  }
  argumentCount = sysbvm_array_getSize((*applicationNode)->arguments);
  callFrameStack.gcRoots.applicationArguments[0xf] = 0;
  while (applicationArgumentCount._7_1_ != false &&
         callFrameStack.gcRoots.applicationArguments[0xf] < argumentCount) {
    gcFrameRecord.roots =
         (sysbvm_tuple_t *)
         sysbvm_array_at((*applicationNode)->arguments,
                         callFrameStack.gcRoots.applicationArguments[0xf]);
    local_15a = false;
    if (applicationArgumentCount._7_1_ != false) {
      local_15a = sysbvm_astNode_isLiteralNode(context,(sysbvm_tuple_t)gcFrameRecord.roots);
    }
    callFrameStack.gcRoots.applicationArguments[0xf] =
         callFrameStack.gcRoots.applicationArguments[0xf] + 1;
    applicationArgumentCount._7_1_ = local_15a;
  }
  if (applicationArgumentCount._7_1_ == false) {
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_68);
    context_local = (sysbvm_context_t *)*applicationNode;
  }
  else {
    memset(&callFrameStackRecord.roots,0,0xb0);
    memset(&i_1,0,0x20);
    callFrameStackRecord.previous._0_4_ = 0;
    callFrameStackRecord.type = 0x11;
    callFrameStackRecord._12_4_ = 0;
    callFrameStackRecord.rootCount = (size_t)&callFrameStack.argumentIndex;
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&i_1);
    applicationFlags = sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags);
    sysbvm_functionCallFrameStack_begin
              (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,
               gcFrame.argumentNode,argumentCount,applicationFlags);
    for (local_158 = 0; local_158 < argumentCount; local_158 = local_158 + 1) {
      gcFrameRecord.roots =
           (sysbvm_tuple_t *)sysbvm_array_at((*applicationNode)->arguments,local_158);
      sVar2 = sysbvm_astLiteralNode_getValue((sysbvm_tuple_t)gcFrameRecord.roots);
      sysbvm_functionCallFrameStack_push
                ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,sVar2);
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&i_1);
    sVar2 = sysbvm_functionCallFrameStack_finish
                      (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_68);
    context_local =
         (sysbvm_context_t *)
         sysbvm_astLiteralNode_create(context,((*applicationNode)->super).sourcePosition,sVar2);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_optimizePureApplication(sysbvm_context_t *context, sysbvm_astFunctionApplicationNode_t **applicationNode)
{
    struct {
        sysbvm_tuple_t argumentNode;
        
        sysbvm_tuple_t literalFunction;
        sysbvm_tuple_t pureCallResult;
        sysbvm_tuple_t argumentValue;
        sysbvm_tuple_t functionType;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    bool canOptimizeCall = false;
    if(sysbvm_astNode_isLiteralNode(context, (*applicationNode)->functionExpression))
    {
        gcFrame.literalFunction = sysbvm_astLiteralNode_getValue((*applicationNode)->functionExpression);
        canOptimizeCall = sysbvm_function_isPure(context, gcFrame.literalFunction);
    }

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);
    for(size_t i = 0; canOptimizeCall && i < applicationArgumentCount ; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        canOptimizeCall = canOptimizeCall && sysbvm_astNode_isLiteralNode(context, gcFrame.argumentNode);
    }

    if(!canOptimizeCall)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return (sysbvm_tuple_t)*applicationNode;
    }

    // Optimize pure function call
    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.literalFunction, applicationArgumentCount, sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags));

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        gcFrame.argumentValue = sysbvm_astLiteralNode_getValue(gcFrame.argumentNode);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argumentValue);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    gcFrame.pureCallResult = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_astLiteralNode_create(context, (*applicationNode)->super.sourcePosition, gcFrame.pureCallResult);
}